

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitBdd.c
# Opt level: O0

int Kit_SopFactorVerify(Vec_Int_t *vCover,Kit_Graph_t *pFForm,int nVars)

{
  int nCap;
  Vec_Int_t *vMemory_00;
  DdNode *n;
  DdNode *n_00;
  int s;
  int RetValue;
  Vec_Int_t *vMemory;
  DdNode *bFunc2;
  DdNode *bFunc1;
  Kit_Sop_t *cSop;
  Kit_Sop_t Sop;
  int nVars_local;
  Kit_Graph_t *pFForm_local;
  Vec_Int_t *vCover_local;
  
  Sop.pCubes._4_4_ = nVars;
  if (Kit_SopFactorVerify::dd == (DdManager *)0x0) {
    Kit_SopFactorVerify::dd = Cudd_Init(0x10,0,0x100,0x40000,0);
  }
  nCap = Vec_IntSize(vCover);
  vMemory_00 = Vec_IntAlloc(nCap);
  Kit_SopCreate((Kit_Sop_t *)&cSop,vCover,Sop.pCubes._4_4_,vMemory_00);
  n = Kit_SopToBdd(Kit_SopFactorVerify::dd,(Kit_Sop_t *)&cSop,Sop.pCubes._4_4_);
  Cudd_Ref(n);
  n_00 = Kit_GraphToBdd(Kit_SopFactorVerify::dd,pFForm);
  Cudd_Ref(n_00);
  if (n != n_00) {
    Extra_bddPrint(Kit_SopFactorVerify::dd,n);
    printf("\n");
    Extra_bddPrint(Kit_SopFactorVerify::dd,n_00);
    printf("\n");
  }
  Cudd_RecursiveDeref(Kit_SopFactorVerify::dd,n);
  Cudd_RecursiveDeref(Kit_SopFactorVerify::dd,n_00);
  Vec_IntFree(vMemory_00);
  return (uint)(n == n_00);
}

Assistant:

int Kit_SopFactorVerify( Vec_Int_t * vCover, Kit_Graph_t * pFForm, int nVars )
{
    static DdManager * dd = NULL;
    Kit_Sop_t Sop, * cSop = &Sop;
    DdNode * bFunc1, * bFunc2;
    Vec_Int_t * vMemory;
    int RetValue;
    // get the manager
    if ( dd == NULL )
        dd = Cudd_Init( 16, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    // derive SOP
    vMemory = Vec_IntAlloc( Vec_IntSize(vCover) );
    Kit_SopCreate( cSop, vCover, nVars, vMemory );
    // get the functions
    bFunc1 = Kit_SopToBdd( dd, cSop, nVars );      Cudd_Ref( bFunc1 );
    bFunc2 = Kit_GraphToBdd( dd, pFForm );         Cudd_Ref( bFunc2 );
//Extra_bddPrint( dd, bFunc1 ); printf("\n");
//Extra_bddPrint( dd, bFunc2 ); printf("\n");
    RetValue = (bFunc1 == bFunc2);
    if ( bFunc1 != bFunc2 )
    {
        int s;
        Extra_bddPrint( dd, bFunc1 ); printf("\n");
        Extra_bddPrint( dd, bFunc2 ); printf("\n");
        s  = 0;
    }
    Cudd_RecursiveDeref( dd, bFunc1 );
    Cudd_RecursiveDeref( dd, bFunc2 );
    Vec_IntFree( vMemory );
    return RetValue;
}